

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O1

void rotateImage(Mat *input,Mat *output,double alpha,double beta,double gamma,double dx,double dy,
                double dz,double f)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  Size SVar6;
  Size SVar7;
  Mat R;
  Size local_7c0;
  Mat A2;
  Size local_758;
  Mat RZ;
  Size local_6f8;
  Mat RY;
  Size local_698;
  Mat trans;
  Size local_630;
  Mat RX;
  Size local_5d0;
  undefined1 local_550 [16];
  Size local_540;
  Size SStack_530;
  Mat local_4e0 [96];
  Mat aMStack_480 [144];
  ulong local_3f0;
  Mat bordered;
  undefined4 uStack_3e4;
  Mat local_3d8 [48];
  ulong *local_3a8;
  Mat local_378 [96];
  Mat aMStack_318 [144];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  Mat local_218 [96];
  Mat local_1b8 [152];
  _OutputArray local_120;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat T;
  Mat A1;
  
  iVar1 = *(int *)(input + 0xc);
  iVar2 = *(int *)(input + 8);
  cv::Mat::Mat((Mat *)&local_288,4,3,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,(Mat *)&local_288);
  *(double *)local_540 = 1.0;
  SVar6 = local_540;
  if ((CONCAT44(local_550._4_4_,local_550._0_4_) != 0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_540),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_540))) {
    cv::MatConstIterator::seek((long)local_550,true);
    SVar6 = local_540;
  }
  local_540 = SVar6;
  SVar6 = SStack_530;
  uVar5 = local_550._8_8_;
  _RX = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  local_5d0 = local_540;
  *(double *)local_540 = 0.0;
  if ((_RX != (Mat *)0x0) &&
     (local_5d0 = (Size)(local_550._8_8_ + (long)local_540), (ulong)SStack_530 <= (ulong)local_5d0))
  {
    local_5d0 = local_540;
    cv::MatConstIterator::seek((long)&RX,true);
  }
  *(double *)local_5d0 = (double)iVar1 * -0.5;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 0.0;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 1.0;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = (double)iVar2 * -0.5;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 0.0;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 0.0;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 0.0;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 0.0;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 0.0;
  SVar7 = local_5d0;
  if ((_RX != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_5d0), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
    SVar7 = local_5d0;
  }
  local_5d0 = SVar7;
  *(double *)local_5d0 = 1.0;
  if ((_RX != (Mat *)0x0) && ((ulong)SVar6 <= (ulong)(uVar5 + (long)local_5d0))) {
    cv::MatConstIterator::seek((long)&RX,true);
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,_RX);
  cv::Mat::Mat(&A1,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)&local_288);
  cv::Mat::Mat((Mat *)&local_288,4,4,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,(Mat *)&local_288);
  *(double *)local_540 = 1.0;
  SVar6 = local_540;
  if ((CONCAT44(local_550._4_4_,local_550._0_4_) != 0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_540),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_540))) {
    cv::MatConstIterator::seek((long)local_550,true);
    SVar6 = local_540;
  }
  local_540 = SVar6;
  SVar6 = SStack_530;
  uVar5 = local_550._8_8_;
  _RY = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  local_698 = local_540;
  *(double *)local_540 = 0.0;
  if ((_RY != (Mat *)0x0) &&
     (local_698 = (Size)(local_550._8_8_ + (long)local_540), (ulong)SStack_530 <= (ulong)local_698))
  {
    local_698 = local_540;
    cv::MatConstIterator::seek((long)&RY,true);
  }
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  dVar3 = (alpha * 3.141592653589793) / 180.0;
  dVar4 = cos(dVar3);
  *(double *)local_698 = dVar4;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  dVar4 = sin(dVar3);
  *(double *)local_698 = -dVar4;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  dVar4 = sin(dVar3);
  *(double *)local_698 = dVar4;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  dVar3 = cos(dVar3);
  *(double *)local_698 = dVar3;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 0.0;
  SVar7 = local_698;
  if ((_RY != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_698), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar7 = local_698;
  }
  local_698 = SVar7;
  *(double *)local_698 = 1.0;
  if ((_RY != (Mat *)0x0) && ((ulong)SVar6 <= (ulong)(uVar5 + (long)local_698))) {
    cv::MatConstIterator::seek((long)&RY,true);
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,_RY);
  cv::Mat::Mat(&RX,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)&local_288);
  cv::Mat::Mat((Mat *)&local_288,4,4,6);
  dVar3 = (beta * 3.141592653589793) / 180.0;
  dVar4 = cos(dVar3);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,(Mat *)&local_288);
  *(double *)local_540 = dVar4;
  SVar6 = local_540;
  if ((CONCAT44(local_550._4_4_,local_550._0_4_) != 0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_540),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_540))) {
    cv::MatConstIterator::seek((long)local_550,true);
    SVar6 = local_540;
  }
  local_540 = SVar6;
  SVar6 = SStack_530;
  uVar5 = local_550._8_8_;
  _RZ = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  local_6f8 = local_540;
  *(double *)local_540 = 0.0;
  if ((_RZ != (Mat *)0x0) &&
     (local_6f8 = (Size)(local_550._8_8_ + (long)local_540), (ulong)SStack_530 <= (ulong)local_6f8))
  {
    local_6f8 = local_540;
    cv::MatConstIterator::seek((long)&RZ,true);
  }
  dVar4 = sin(dVar3);
  *(double *)local_6f8 = -dVar4;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 1.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  dVar4 = sin(dVar3);
  *(double *)local_6f8 = dVar4;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  dVar3 = cos(dVar3);
  *(double *)local_6f8 = dVar3;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 0.0;
  SVar7 = local_6f8;
  if ((_RZ != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_6f8), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    SVar7 = local_6f8;
  }
  local_6f8 = SVar7;
  *(double *)local_6f8 = 1.0;
  if ((_RZ != (Mat *)0x0) && ((ulong)SVar6 <= (ulong)(uVar5 + (long)local_6f8))) {
    cv::MatConstIterator::seek((long)&RZ,true);
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,_RZ);
  cv::Mat::Mat(&RY,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)&local_288);
  cv::Mat::Mat((Mat *)&local_288,4,4,6);
  dVar3 = (gamma * 3.141592653589793) / 180.0;
  dVar4 = cos(dVar3);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,(Mat *)&local_288);
  *(double *)local_540 = dVar4;
  SVar6 = local_540;
  if ((CONCAT44(local_550._4_4_,local_550._0_4_) != 0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_540),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_540))) {
    cv::MatConstIterator::seek((long)local_550,true);
    SVar6 = local_540;
  }
  local_540 = SVar6;
  SVar7 = SStack_530;
  SVar6 = local_540;
  uVar5 = local_550._8_8_;
  _R = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  local_7c0 = local_540;
  dVar4 = sin(dVar3);
  *(double *)SVar6 = -dVar4;
  if ((_R != (Mat *)0x0) &&
     (local_7c0 = (Size)(uVar5 + (long)SVar6), (ulong)SVar7 <= (ulong)local_7c0)) {
    local_7c0 = SVar6;
    cv::MatConstIterator::seek((long)&R,true);
  }
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  dVar4 = sin(dVar3);
  *(double *)local_7c0 = dVar4;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  dVar3 = cos(dVar3);
  *(double *)local_7c0 = dVar3;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 1.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 0.0;
  SVar6 = local_7c0;
  if ((_R != (Mat *)0x0) &&
     (SVar6 = (Size)(uVar5 + (long)local_7c0), (ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar6 = local_7c0;
  }
  local_7c0 = SVar6;
  *(double *)local_7c0 = 1.0;
  if ((_R != (Mat *)0x0) && ((ulong)SVar7 <= (ulong)(uVar5 + (long)local_7c0))) {
    cv::MatConstIterator::seek((long)&R,true);
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,_R);
  cv::Mat::Mat(&RZ,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)&local_288);
  cv::operator*((Mat *)&local_288,&RX);
  cv::operator*((MatExpr *)&bordered,(Mat *)&local_288);
  cv::Mat::Mat(&R);
  (**(code **)(*(long *)CONCAT44(uStack_3e4,_bordered) + 0x18))
            ((long *)CONCAT44(uStack_3e4,_bordered),&bordered,&R,0xffffffff);
  cv::Mat::~Mat(aMStack_318);
  cv::Mat::~Mat(local_378);
  cv::Mat::~Mat(local_3d8);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat(local_218);
  cv::Mat::~Mat((Mat *)&local_278);
  cv::Mat::Mat((Mat *)&local_288,4,4,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,(Mat *)&local_288);
  *(double *)local_540 = 1.0;
  SVar6 = local_540;
  if ((CONCAT44(local_550._4_4_,local_550._0_4_) != 0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_540),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_540))) {
    cv::MatConstIterator::seek((long)local_550,true);
    SVar6 = local_540;
  }
  local_540 = SVar6;
  SVar6 = SStack_530;
  uVar5 = local_550._8_8_;
  _A2 = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  local_758 = local_540;
  *(double *)local_540 = 0.0;
  if ((_A2 != (Mat *)0x0) &&
     (local_758 = (Size)(local_550._8_8_ + (long)local_540), (ulong)SStack_530 <= (ulong)local_758))
  {
    local_758 = local_540;
    cv::MatConstIterator::seek((long)&A2,true);
  }
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = dx;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 1.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = dy;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 1.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = dz;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 0.0;
  SVar7 = local_758;
  if ((_A2 != (Mat *)0x0) &&
     (SVar7 = (Size)(uVar5 + (long)local_758), (ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
    SVar7 = local_758;
  }
  local_758 = SVar7;
  *(double *)local_758 = 1.0;
  if ((_A2 != (Mat *)0x0) && ((ulong)SVar6 <= (ulong)(uVar5 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&A2,true);
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,_A2);
  cv::Mat::Mat(&T,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)&local_288);
  cv::Mat::Mat((Mat *)&local_288,3,4,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,(Mat *)&local_288);
  *(double *)local_540 = f;
  SVar6 = local_540;
  if ((CONCAT44(local_550._4_4_,local_550._0_4_) != 0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_540),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_540))) {
    cv::MatConstIterator::seek((long)local_550,true);
    SVar6 = local_540;
  }
  local_540 = SVar6;
  _trans = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  local_630 = local_540;
  *(double *)local_540 = 0.0;
  if ((_trans != (Mat *)0x0) &&
     (local_630 = (Size)(local_550._8_8_ + (long)local_540), (ulong)SStack_530 <= (ulong)local_630))
  {
    local_630 = local_540;
    cv::MatConstIterator::seek((long)&trans,true);
  }
  *(double *)local_630 = (double)iVar1 * 0.5;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = 0.0;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = 0.0;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = f;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = (double)iVar2 * 0.5;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = 0.0;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = 0.0;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = 0.0;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = 1.0;
  SVar6 = local_630;
  if ((_trans != (Mat *)0x0) &&
     (SVar6 = (Size)(local_550._8_8_ + (long)local_630),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
    SVar6 = local_630;
  }
  local_630 = SVar6;
  *(double *)local_630 = 0.0;
  if ((_trans != (Mat *)0x0) && ((ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)local_630))) {
    cv::MatConstIterator::seek((long)&trans,true);
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,_trans);
  cv::Mat::Mat(&A2,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)&local_288);
  cv::operator*((Mat *)local_550,&R);
  cv::operator*((Mat *)&local_288,(MatExpr *)&T);
  cv::operator*(&bordered,(MatExpr *)&A2);
  cv::Mat::Mat(&trans);
  (**(code **)(*(long *)CONCAT44(uStack_3e4,_bordered) + 0x18))
            ((long *)CONCAT44(uStack_3e4,_bordered),&bordered,&trans,0xffffffff);
  cv::Mat::~Mat(aMStack_318);
  cv::Mat::~Mat(local_378);
  cv::Mat::~Mat(local_3d8);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat(local_218);
  cv::Mat::~Mat((Mat *)&local_278);
  cv::Mat::~Mat(aMStack_480);
  cv::Mat::~Mat(local_4e0);
  cv::Mat::~Mat((Mat *)(local_550 + 0x10));
  cv::Mat::Mat(&bordered);
  local_540.width = 0;
  local_540.height = 0;
  local_550._0_4_ = 0x1010000;
  local_120.super__InputArray.sz.width = 0;
  local_120.super__InputArray.sz.height = 0;
  local_120.super__InputArray.flags = 0x2010000;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_550._8_8_ = input;
  local_120.super__InputArray.obj = &bordered;
  cv::copyMakeBorder((_InputArray *)local_550,&local_120,*(int *)(input + 8),*(int *)(input + 8),
                     (int)((double)*(int *)(input + 0xc) * 0.3),
                     (int)((double)*(int *)(input + 0xc) * 0.3),0,(Scalar_ *)&local_288);
  local_540.width = 0;
  local_540.height = 0;
  local_550._0_4_ = 0x1010000;
  local_120.super__InputArray.sz.width = 0;
  local_120.super__InputArray.sz.height = 0;
  local_120.super__InputArray.flags = 0x2010000;
  local_f8 = 0;
  local_108 = 0x1010000;
  local_3f0 = *local_3a8 << 0x20 | *local_3a8 >> 0x20;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_550._8_8_ = &bordered;
  local_120.super__InputArray.obj = output;
  local_100 = &trans;
  cv::warpPerspective();
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(&trans);
  cv::Mat::~Mat(&A2);
  cv::Mat::~Mat(&T);
  cv::Mat::~Mat(&R);
  cv::Mat::~Mat(&RZ);
  cv::Mat::~Mat(&RY);
  cv::Mat::~Mat(&RX);
  cv::Mat::~Mat(&A1);
  return;
}

Assistant:

void rotateImage(const cv::Mat &input,cv::Mat &output, double alpha, double beta, double gamma, double dx, double dy, double dz, double f) {
    alpha = (alpha)*CV_PI/180.;
    beta = (beta)*CV_PI/180.;
    gamma = (gamma)*CV_PI/180.;
    // get width and height for ease of use in cv::Matrices
    double w = (double)input.cols;
    double h = (double)input.rows;
    // Projection 2D -> 3D cv::Matrix
    cv::Mat A1 = (cv::Mat_<double>(4,3) <<
              1, 0, -w/2.,
              0, 1, -h/2.,
              0, 0, 0,
              0, 0, 1);
    // Rotation cv::Matrices around the X, Y, and Z axis
    cv::Mat RX = (cv::Mat_<double>(4, 4) <<
              1,          0,           0, 0,
              0, cos(alpha), -sin(alpha), 0,
              0, sin(alpha),  cos(alpha), 0,
              0,          0,           0, 1);
    cv::Mat RY = (cv::Mat_<double>(4, 4) <<
              cos(beta), 0, -sin(beta), 0,
              0, 1,          0, 0,
              sin(beta), 0,  cos(beta), 0,
              0, 0,          0, 1);
    cv::Mat RZ = (cv::Mat_<double>(4, 4) <<
              cos(gamma), -sin(gamma), 0, 0,
              sin(gamma),  cos(gamma), 0, 0,
              0,          0,           1, 0,
              0,          0,           0, 1);
    // Composed rotation cv::Matrix with (RX, RY, RZ)
    cv::Mat R = RX * RY * RZ;
    // Translation cv::Matrix
    cv::Mat T = (cv::Mat_<double>(4, 4) <<
             1, 0, 0, dx,
             0, 1, 0, dy,
             0, 0, 1, dz,
             0, 0, 0, 1);
    // 3D -> 2D cv::Matrix
    cv::Mat A2 = (cv::Mat_<double>(3,4) <<
              f, 0, w/2, 0,
              0, f, h/2, 0,
              0, 0,   1, 0);
    // Final transforcv::Mation cv::Matrix
    cv::Mat trans = A2 * (T * (R * A1));
    // Apply cv::Matrix transforcv::Mation
    cv::Mat bordered;
    cv::copyMakeBorder(input, bordered, input.rows, input.rows, input.cols*.3, input.cols*.3, cv::BORDER_CONSTANT, cv::Scalar(0,0,0));
    cv::warpPerspective(bordered, output, trans, bordered.size(), cv::INTER_LANCZOS4);
}